

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::Descriptor::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Descriptor *this)

{
  ostream *poVar1;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Descriptor *local_18;
  Descriptor *this_local;
  
  local_18 = this;
  this_local = (Descriptor *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Descriptor:");
  poVar1 = std::operator<<(poVar1,"\n\tType: ");
  EntityType::GetAsString_abi_cxx11_(&local_1d0,&this->m_Type);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Descriptor::GetAsString() const
{
    KStringStream ss;

    ss << "Descriptor:"
       << "\n\tType: " << m_Type.GetAsString()
       << "\n";

    return ss.str();
}